

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_time.c
# Opt level: O0

int pt_time_update_cyc(pt_time *time,pt_packet_cyc *packet,pt_config *config,uint64_t fcr)

{
  uint64_t uVar1;
  int errcode;
  uint64_t fc;
  uint64_t cyc;
  uint64_t fcr_local;
  pt_config *config_local;
  pt_packet_cyc *packet_local;
  pt_time *time_local;
  
  if (((time == (pt_time *)0x0) || (packet == (pt_packet_cyc *)0x0)) || (config == (pt_config *)0x0)
     ) {
    time_local._4_4_ = -1;
  }
  else if (fcr == 0) {
    time->lost_cyc = time->lost_cyc + 1;
    time_local._4_4_ = 0;
  }
  else {
    fc = packet->value;
    uVar1 = time->fc;
    cyc = fcr;
    packet_local = (pt_packet_cyc *)time;
    if ((uVar1 != 0) ||
       (fcr_local = (uint64_t)config, config_local = (pt_config *)packet,
       time_local._4_4_ = pt_time_adjust_cyc(&fc,time,config,fcr), -1 < time_local._4_4_)) {
      uVar1 = (fc * cyc >> 8) + uVar1;
      packet_local[2].value = uVar1;
      packet_local->value = packet_local[1].value + uVar1;
      time_local._4_4_ = 0;
    }
  }
  return time_local._4_4_;
}

Assistant:

int pt_time_update_cyc(struct pt_time *time,
		       const struct pt_packet_cyc *packet,
		       const struct pt_config *config, uint64_t fcr)
{
	uint64_t cyc, fc;

	if (!time || !packet || !config)
		return -pte_internal;

	if (!fcr) {
		time->lost_cyc += 1;
		return 0;
	}

	cyc = packet->value;
	fc = time->fc;
	if (!fc) {
		int errcode;

		errcode = pt_time_adjust_cyc(&cyc, time, config, fcr);
		if (errcode < 0)
			return errcode;
	}

	fc += (cyc * fcr) >> pt_tcal_fcr_shr;

	time->fc = fc;
	time->tsc = time->base + fc;

	return 0;
}